

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

int backtracer_settracing(void *x,int tracing)

{
  t_msgstack *local_28;
  t_msgstack *m;
  int tracing_local;
  void *x_local;
  
  if (tracing == 0) {
    local_28 = backtracer_stack;
    post("backtrace:");
    for (; local_28 != (t_msgstack *)0x0; local_28 = local_28->m_next) {
      backtracer_printmsg(local_28->m_owner->b_owner,local_28->m_sel,local_28->m_argc,
                          local_28->m_argv);
    }
    backtracer_tracing = 0;
    x_local._4_4_ = 0;
  }
  else if (backtracer_tracing == 0) {
    backtracer_tracing = 1;
    x_local._4_4_ = 1;
  }
  else {
    pd_error(x,"trace: already tracing");
    x_local._4_4_ = 0;
  }
  return x_local._4_4_;
}

Assistant:

int backtracer_settracing(void *x, int tracing)
{
    if (tracing)
    {
        if (backtracer_tracing)
        {
            pd_error(x, "trace: already tracing");
            return (0);
        }
        else
        {
            backtracer_tracing = 1;
            return (1);
        }
    }
    else    /* when stopping, print backtrace to here */
    {
        t_msgstack *m = backtracer_stack;
        post("backtrace:");
        while (m)
        {
            backtracer_printmsg(m->m_owner->b_owner, m->m_sel,
                m->m_argc, m->m_argv);
            m = m->m_next;
        }
        backtracer_tracing = 0;
        return (0);
    }
}